

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O3

void aom_avg_8x8_quad_avx2(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  lVar2 = (long)x16_idx + (long)(y16_idx * p);
  lVar4 = (long)p;
  lVar3 = lVar4 * 8 + lVar2;
  auVar6._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 8 + lVar2) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + (long)x16_idx + (long)(y16_idx * p));
  auVar6._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 8 + lVar2);
  auVar6 = vpsadbw_avx2(auVar6,ZEXT1632((undefined1  [16])0x0));
  auVar8._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 + lVar2);
  auVar8._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 + lVar3);
  auVar7 = vpsadbw_avx2(auVar8,ZEXT1632((undefined1  [16])0x0));
  auVar6 = vpaddw_avx2(auVar7,auVar6);
  auVar9._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 2 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 2 + lVar2);
  auVar9._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 2 + lVar3);
  auVar5 = ZEXT1632((undefined1  [16])0x0);
  auVar7 = vpsadbw_avx2(auVar9,auVar5);
  auVar10._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 3 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 3 + lVar2);
  auVar10._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 3 + lVar3);
  auVar8 = vpsadbw_avx2(auVar10,auVar5);
  auVar7 = vpaddw_avx2(auVar7,auVar8);
  auVar11._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 4 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 4 + lVar2);
  auVar11._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 4 + lVar3);
  auVar6 = vpaddw_avx2(auVar6,auVar7);
  auVar7 = vpsadbw_avx2(auVar11,auVar5);
  auVar12._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 5 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 5 + lVar2);
  auVar12._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 5 + lVar3);
  auVar8 = vpsadbw_avx2(auVar12,auVar5);
  auVar7 = vpaddw_avx2(auVar7,auVar8);
  auVar13._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 6 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 6 + lVar2);
  auVar13._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 6 + lVar3);
  auVar8 = vpsadbw_avx2(auVar13,ZEXT1632((undefined1  [16])0x0));
  auVar7 = vpaddw_avx2(auVar7,auVar8);
  auVar6 = vpaddw_avx2(auVar6,auVar7);
  auVar5._0_16_ =
       ZEXT116(0) * *(undefined1 (*) [16])(s + lVar4 * 7 + lVar3) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 7 + lVar2);
  auVar5._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
       ZEXT116(1) * *(undefined1 (*) [16])(s + lVar4 * 7 + lVar3);
  auVar7 = vpsadbw_avx2(auVar5,ZEXT1632((undefined1  [16])0x0));
  auVar6 = vpaddw_avx2(auVar6,auVar7);
  auVar7._8_4_ = 0x20;
  auVar7._0_8_ = 0x2000000020;
  auVar7._12_4_ = 0x20;
  auVar7._16_4_ = 0x20;
  auVar7._20_4_ = 0x20;
  auVar7._24_4_ = 0x20;
  auVar7._28_4_ = 0x20;
  auVar6 = vpaddd_avx2(auVar6,auVar7);
  auVar6 = vpsrld_avx2(auVar6,6);
  auVar1 = vshufps_avx(auVar6._0_16_,auVar6._16_16_,0x88);
  *(undefined1 (*) [16])avg = auVar1;
  return;
}

Assistant:

void aom_avg_8x8_quad_avx2(const uint8_t *s, int p, int x16_idx, int y16_idx,
                           int *avg) {
  const uint8_t *s_y0 = s + y16_idx * p + x16_idx;
  const uint8_t *s_y1 = s_y0 + 8 * p;
  __m256i sum0, sum1, s0, s1, s2, s3, u0;
  u0 = _mm256_setzero_si256();
  s0 = _mm256_sad_epu8(yy_loadu2_128(s_y1, s_y0), u0);
  s1 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + p, s_y0 + p), u0);
  s2 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 2 * p, s_y0 + 2 * p), u0);
  s3 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 3 * p, s_y0 + 3 * p), u0);
  sum0 = _mm256_add_epi16(s0, s1);
  sum1 = _mm256_add_epi16(s2, s3);
  s0 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 4 * p, s_y0 + 4 * p), u0);
  s1 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 5 * p, s_y0 + 5 * p), u0);
  s2 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 6 * p, s_y0 + 6 * p), u0);
  s3 = _mm256_sad_epu8(yy_loadu2_128(s_y1 + 7 * p, s_y0 + 7 * p), u0);
  sum0 = _mm256_add_epi16(sum0, _mm256_add_epi16(s0, s1));
  sum1 = _mm256_add_epi16(sum1, _mm256_add_epi16(s2, s3));
  sum0 = _mm256_add_epi16(sum0, sum1);

  // (avg + 32) >> 6
  __m256i rounding = _mm256_set1_epi32(32);
  sum0 = _mm256_add_epi32(sum0, rounding);
  sum0 = _mm256_srli_epi32(sum0, 6);
  __m128i lo = _mm256_castsi256_si128(sum0);
  __m128i hi = _mm256_extracti128_si256(sum0, 1);
  avg[0] = _mm_cvtsi128_si32(lo);
  avg[1] = _mm_extract_epi32(lo, 2);
  avg[2] = _mm_cvtsi128_si32(hi);
  avg[3] = _mm_extract_epi32(hi, 2);
}